

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaAllocator_T::PrintDetailedMap(VmaAllocator_T *this,VmaJsonWriter *json)

{
  bool bVar1;
  VmaVector<char,_VmaStlAllocator<char>_> *pVVar2;
  size_t sVar3;
  VmaBlockVector *this_00;
  VmaStringBuilder *pVVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  VmaBlockVector *blockVector;
  ItemType *this_01;
  pthread_rwlock_t *__rwlock;
  ulong local_60;
  byte local_3f [10];
  byte local_35 [5];
  
  VmaJsonWriter::BeginString(json,"DefaultPools");
  pVVar2 = &json->m_SB->m_Data;
  sVar3 = pVVar2->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
  pVVar2->m_pArray[sVar3] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::BeginObject(json,false);
  if ((this->m_MemProps).memoryTypeCount != 0) {
    uVar12 = 0;
    do {
      this_00 = this->m_pBlockVectors[uVar12];
      if (this_00 != (VmaBlockVector *)0x0) {
        VmaJsonWriter::BeginString(json,"Type ");
        pVVar4 = json->m_SB;
        local_3f[1] = 0;
        pbVar11 = local_3f + 1;
        uVar10 = uVar12;
        do {
          uVar9 = uVar10 & 0xffffffff;
          uVar8 = (uint)uVar10;
          uVar10 = uVar9 / 10;
          pbVar11[-1] = (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
          pbVar11 = pbVar11 + -1;
        } while (9 < uVar8);
        VmaStringBuilder::Add(pVVar4,(char *)pbVar11);
        pVVar2 = &json->m_SB->m_Data;
        sVar3 = pVVar2->m_Count;
        VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
        pVVar2->m_pArray[sVar3] = '\"';
        json->m_InsideString = false;
        VmaJsonWriter::BeginObject(json,false);
        VmaJsonWriter::BeginString(json,"PreferredBlockSize");
        pVVar2 = &json->m_SB->m_Data;
        sVar3 = pVVar2->m_Count;
        VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
        pVVar2->m_pArray[sVar3] = '\"';
        json->m_InsideString = false;
        VmaJsonWriter::WriteNumber(json,this_00->m_PreferredBlockSize);
        VmaJsonWriter::BeginString(json,"Blocks");
        pVVar2 = &json->m_SB->m_Data;
        sVar3 = pVVar2->m_Count;
        VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
        pVVar2->m_pArray[sVar3] = '\"';
        json->m_InsideString = false;
        VmaBlockVector::PrintDetailedMap(this_00,json);
        VmaJsonWriter::BeginString(json,"DedicatedAllocations");
        pVVar2 = &json->m_SB->m_Data;
        sVar3 = pVVar2->m_Count;
        VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
        pVVar2->m_pArray[sVar3] = '\"';
        json->m_InsideString = false;
        VmaDedicatedAllocationList::BuildStatsString(this->m_DedicatedAllocations + uVar12,json);
        VmaJsonWriter::EndObject(json);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (this->m_MemProps).memoryTypeCount);
  }
  VmaJsonWriter::EndObject(json);
  VmaJsonWriter::BeginString(json,"CustomPools");
  pVVar2 = &json->m_SB->m_Data;
  sVar3 = pVVar2->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
  pVVar2->m_pArray[sVar3] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::BeginObject(json,false);
  bVar1 = this->m_UseMutex;
  __rwlock = (pthread_rwlock_t *)0x0;
  if (bVar1 != false) {
    __rwlock = (pthread_rwlock_t *)&this->m_PoolsMutex;
  }
  if (bVar1 == true) {
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  if (((this->m_Pools).m_Count != 0) && ((this->m_MemProps).memoryTypeCount != 0)) {
    uVar8 = 0;
    do {
      this_01 = (this->m_Pools).m_Front;
      if (this_01 != (ItemType *)0x0) {
        bVar5 = true;
        local_60 = 0;
        do {
          if ((this_01->m_BlockVector).m_MemoryTypeIndex == uVar8) {
            if (bVar5) {
              VmaJsonWriter::BeginString(json,"Type ");
              pVVar4 = json->m_SB;
              local_3f[1] = 0;
              pbVar11 = local_3f + 1;
              uVar7 = uVar8;
              do {
                pbVar11[-1] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                pbVar11 = pbVar11 + -1;
                bVar5 = 9 < uVar7;
                uVar7 = uVar7 / 10;
              } while (bVar5);
              VmaStringBuilder::Add(pVVar4,(char *)pbVar11);
              pVVar2 = &json->m_SB->m_Data;
              sVar3 = pVVar2->m_Count;
              VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
              pVVar2->m_pArray[sVar3] = '\"';
              json->m_InsideString = false;
              bVar5 = false;
              VmaJsonWriter::BeginArray(json,false);
            }
            VmaJsonWriter::BeginObject(json,false);
            VmaJsonWriter::BeginString(json,"Name");
            pVVar2 = &json->m_SB->m_Data;
            sVar3 = pVVar2->m_Count;
            VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
            pVVar2->m_pArray[sVar3] = '\"';
            json->m_InsideString = false;
            VmaJsonWriter::BeginValue(json,false);
            pVVar2 = &json->m_SB->m_Data;
            sVar3 = pVVar2->m_Count;
            VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
            pVVar2->m_pArray[sVar3] = '\"';
            json->m_InsideString = true;
            pVVar4 = json->m_SB;
            local_35[1] = 0;
            pbVar11 = local_35 + 1;
            uVar12 = local_60;
            do {
              pbVar11[-1] = (char)uVar12 + (char)(uVar12 / 10) * -10 | 0x30;
              pbVar11 = pbVar11 + -1;
              bVar6 = 9 < uVar12;
              uVar12 = uVar12 / 10;
            } while (bVar6);
            VmaStringBuilder::Add(pVVar4,(char *)pbVar11);
            if (this_01->m_Name != (char *)0x0) {
              VmaJsonWriter::ContinueString(json," - ");
              VmaJsonWriter::ContinueString(json,this_01->m_Name);
            }
            pVVar2 = &json->m_SB->m_Data;
            sVar3 = pVVar2->m_Count;
            VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
            pVVar2->m_pArray[sVar3] = '\"';
            json->m_InsideString = false;
            VmaJsonWriter::BeginString(json,"PreferredBlockSize");
            pVVar2 = &json->m_SB->m_Data;
            sVar3 = pVVar2->m_Count;
            VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
            pVVar2->m_pArray[sVar3] = '\"';
            json->m_InsideString = false;
            VmaJsonWriter::WriteNumber(json,(this_01->m_BlockVector).m_PreferredBlockSize);
            VmaJsonWriter::BeginString(json,"Blocks");
            pVVar2 = &json->m_SB->m_Data;
            sVar3 = pVVar2->m_Count;
            VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
            pVVar2->m_pArray[sVar3] = '\"';
            json->m_InsideString = false;
            VmaBlockVector::PrintDetailedMap(&this_01->m_BlockVector,json);
            VmaJsonWriter::BeginString(json,"DedicatedAllocations");
            pVVar2 = &json->m_SB->m_Data;
            sVar3 = pVVar2->m_Count;
            VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar2,sVar3 + 1);
            pVVar2->m_pArray[sVar3] = '\"';
            json->m_InsideString = false;
            VmaDedicatedAllocationList::BuildStatsString(&this_01->m_DedicatedAllocations,json);
            VmaJsonWriter::EndObject(json);
            local_60 = local_60 + 1;
          }
          this_01 = this_01->m_NextPool;
        } while (this_01 != (VmaPool_T *)0x0);
        if (!bVar5) {
          VmaJsonWriter::EndArray(json);
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->m_MemProps).memoryTypeCount);
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  VmaJsonWriter::EndObject(json);
  return;
}

Assistant:

void VmaAllocator_T::PrintDetailedMap(VmaJsonWriter& json)
{
    json.WriteString("DefaultPools");
    json.BeginObject();
    {
        for (uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
        {
            VmaBlockVector* pBlockVector = m_pBlockVectors[memTypeIndex];
            VmaDedicatedAllocationList& dedicatedAllocList = m_DedicatedAllocations[memTypeIndex];
            if (pBlockVector != VMA_NULL)
            {
                json.BeginString("Type ");
                json.ContinueString(memTypeIndex);
                json.EndString();
                json.BeginObject();
                {
                    json.WriteString("PreferredBlockSize");
                    json.WriteNumber(pBlockVector->GetPreferredBlockSize());

                    json.WriteString("Blocks");
                    pBlockVector->PrintDetailedMap(json);

                    json.WriteString("DedicatedAllocations");
                    dedicatedAllocList.BuildStatsString(json);
                }
                json.EndObject();
            }
        }
    }
    json.EndObject();

    json.WriteString("CustomPools");
    json.BeginObject();
    {
        VmaMutexLockRead lock(m_PoolsMutex, m_UseMutex);
        if (!m_Pools.IsEmpty())
        {
            for (uint32_t memTypeIndex = 0; memTypeIndex < GetMemoryTypeCount(); ++memTypeIndex)
            {
                bool displayType = true;
                size_t index = 0;
                for (VmaPool pool = m_Pools.Front(); pool != VMA_NULL; pool = m_Pools.GetNext(pool))
                {
                    VmaBlockVector& blockVector = pool->m_BlockVector;
                    if (blockVector.GetMemoryTypeIndex() == memTypeIndex)
                    {
                        if (displayType)
                        {
                            json.BeginString("Type ");
                            json.ContinueString(memTypeIndex);
                            json.EndString();
                            json.BeginArray();
                            displayType = false;
                        }

                        json.BeginObject();
                        {
                            json.WriteString("Name");
                            json.BeginString();
                            json.ContinueString_Size(index++);
                            if (pool->GetName())
                            {
                                json.ContinueString(" - ");
                                json.ContinueString(pool->GetName());
                            }
                            json.EndString();

                            json.WriteString("PreferredBlockSize");
                            json.WriteNumber(blockVector.GetPreferredBlockSize());

                            json.WriteString("Blocks");
                            blockVector.PrintDetailedMap(json);

                            json.WriteString("DedicatedAllocations");
                            pool->m_DedicatedAllocations.BuildStatsString(json);
                        }
                        json.EndObject();
                    }
                }

                if (!displayType)
                    json.EndArray();
            }
        }
    }
    json.EndObject();
}